

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O2

Data * __thiscall
QTzTimeZonePrivate::previousTransition
          (Data *__return_storage_ptr__,QTzTimeZonePrivate *this,qint64 beforeMSecsSinceEpoch)

{
  long lVar1;
  undefined8 uVar2;
  undefined1 uVar3;
  QTzTransitionTime *pQVar4;
  difference_type __d;
  undefined1 *puVar5;
  ulong uVar6;
  undefined1 *puVar7;
  ulong uVar8;
  Data *pDVar9;
  QTzTransitionTime *pQVar10;
  long in_FS_OFFSET;
  QTzTransitionTime tran;
  QTzTransitionTime tran_00;
  QArrayDataPointer<QTimeZonePrivate::Data> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->cached_data).m_posixRule.d.size == 0) {
    pQVar10 = (this->cached_data).m_tranTimes.d.ptr;
    uVar8 = (this->cached_data).m_tranTimes.d.size;
    pQVar4 = pQVar10;
LAB_003b4965:
    while (uVar6 = uVar8, 0 < (long)uVar6) {
      uVar8 = uVar6 >> 1;
      if (pQVar10[uVar8].atMSecsSinceEpoch < beforeMSecsSinceEpoch) {
        pQVar10 = pQVar10 + uVar8 + 1;
        uVar8 = ~uVar8 + uVar6;
      }
    }
    if (pQVar4 < pQVar10) {
      uVar2 = pQVar10[-1].atMSecsSinceEpoch;
      uVar3 = pQVar10[-1].ruleIndex;
      tran.ruleIndex = uVar3;
      tran.atMSecsSinceEpoch = uVar2;
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        tran._9_7_ = 0;
        dataForTzTransition(__return_storage_ptr__,this,tran);
        return __return_storage_ptr__;
      }
      goto LAB_003b4a83;
    }
    (__return_storage_ptr__->abbreviation).d.d = (Data *)0x0;
    (__return_storage_ptr__->abbreviation).d.ptr = (char16_t *)0x0;
    (__return_storage_ptr__->abbreviation).d.size = 0;
    __return_storage_ptr__->atMSecsSinceEpoch = -0x8000000000000000;
    __return_storage_ptr__->offsetFromUtc = -0x80000000;
    __return_storage_ptr__->standardTimeOffset = -0x80000000;
    __return_storage_ptr__->daylightTimeOffset = -0x80000000;
  }
  else {
    uVar8 = (this->cached_data).m_tranTimes.d.size;
    if ((uVar8 != 0) &&
       (pQVar10 = (this->cached_data).m_tranTimes.d.ptr, pQVar4 = pQVar10,
       beforeMSecsSinceEpoch <= pQVar10[uVar8 - 1].atMSecsSinceEpoch)) goto LAB_003b4965;
    local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.ptr = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    getPosixTransitions((QList<QTimeZonePrivate::Data> *)&local_48,this,beforeMSecsSinceEpoch);
    puVar5 = (undefined1 *)local_48.size;
    pDVar9 = local_48.ptr;
    while (puVar7 = puVar5, 0 < (long)puVar7) {
      puVar5 = (undefined1 *)((ulong)puVar7 >> 1);
      if (pDVar9[(long)puVar5].atMSecsSinceEpoch < beforeMSecsSinceEpoch) {
        pDVar9 = pDVar9 + (long)(puVar5 + 1);
        puVar5 = puVar7 + ~(ulong)puVar5;
      }
    }
    if (local_48.ptr < pDVar9) {
      QTimeZonePrivate::Data::Data(__return_storage_ptr__,pDVar9 + -1);
    }
    else {
      lVar1 = (this->cached_data).m_tranTimes.d.size;
      if (lVar1 == 0) {
        (__return_storage_ptr__->abbreviation).d.d = (Data *)0x0;
        (__return_storage_ptr__->abbreviation).d.ptr = (char16_t *)0x0;
        (__return_storage_ptr__->abbreviation).d.size = 0;
        __return_storage_ptr__->atMSecsSinceEpoch = -0x8000000000000000;
        __return_storage_ptr__->offsetFromUtc = -0x80000000;
        __return_storage_ptr__->standardTimeOffset = -0x80000000;
        __return_storage_ptr__->daylightTimeOffset = -0x80000000;
      }
      else {
        pQVar10 = (this->cached_data).m_tranTimes.d.ptr;
        pQVar4 = pQVar10 + lVar1 + -1;
        tran_00.ruleIndex = pQVar4->ruleIndex;
        tran_00._9_3_ = *(undefined3 *)&pQVar4->field_0x9;
        tran_00.atMSecsSinceEpoch = pQVar10[lVar1 + -1].atMSecsSinceEpoch;
        tran_00._12_4_ = 0;
        dataForTzTransition(__return_storage_ptr__,this,tran_00);
      }
    }
    QArrayDataPointer<QTimeZonePrivate::Data>::~QArrayDataPointer(&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
LAB_003b4a83:
  __stack_chk_fail();
}

Assistant:

QTimeZonePrivate::Data QTzTimeZonePrivate::previousTransition(qint64 beforeMSecsSinceEpoch) const
{
    // If the required time is after the last transition (or there were none)
    // and we have a POSIX rule, then use it:
    if (!cached_data.m_posixRule.isEmpty()
        && (tranCache().isEmpty() || tranCache().last().atMSecsSinceEpoch < beforeMSecsSinceEpoch)) {
        QList<Data> posixTrans = getPosixTransitions(beforeMSecsSinceEpoch);
        auto it = std::partition_point(posixTrans.cbegin(), posixTrans.cend(),
                                       [beforeMSecsSinceEpoch] (const Data &at) {
                                           return at.atMSecsSinceEpoch < beforeMSecsSinceEpoch;
                                       });
        if (it > posixTrans.cbegin())
            return *--it;
        // It fell between the last transition (if any) and the first of the POSIX rule:
        return tranCache().isEmpty() ? Data{} : dataForTzTransition(tranCache().last());
    }

    // Otherwise if we can find a valid tran then use its rule
    auto last = std::partition_point(tranCache().cbegin(), tranCache().cend(),
                                     [beforeMSecsSinceEpoch] (QTzTransitionTime at) {
                                         return at.atMSecsSinceEpoch < beforeMSecsSinceEpoch;
                                     });
    return last > tranCache().cbegin() ? dataForTzTransition(*--last) : Data{};
}